

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::simplify
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this)

{
  op_interface<viennamath::rt_expression_interface<double>_> *poVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  _func_int **extraout_XMM0_Qa;
  
  iVar2 = (*((this->lhs_)._M_ptr)->_vptr_rt_expression_interface[8])();
  if ((char)iVar2 != '\0') {
    iVar2 = (*((this->rhs_)._M_ptr)->_vptr_rt_expression_interface[8])();
    if ((char)iVar2 != '\0') {
      prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
      (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[9])(this);
      prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_0011e218;
      prVar3[1]._vptr_rt_expression_interface = extraout_XMM0_Qa;
      return prVar3;
    }
  }
  poVar1 = (this->op_)._M_ptr;
  iVar2 = (*poVar1->_vptr_op_interface[9])(poVar1,(this->lhs_)._M_ptr,(this->rhs_)._M_ptr);
  return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
}

Assistant:

InterfaceType * simplify() const
      {
        if (lhs_->is_constant() && rhs_->is_constant())
          return new rt_constant<numeric_type, InterfaceType>( unwrap() );

        //std::cout << "Optimization forwarded to " << op_->str() << std::endl;
        return op_->simplify(lhs_.get(), rhs_.get());
      }